

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

void GenerateMixingConstants(void)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t c_1;
  int i_1;
  uint8_t match [256];
  uint32_t c;
  int i;
  uint32_t b;
  int primefail;
  int matchfail;
  int popfail;
  int bitfail;
  int trials;
  int count;
  Rand r;
  uint32_t in_stack_fffffffffffffebc;
  uint in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  char local_138 [216];
  uint32_t in_stack_ffffffffffffffa0;
  int local_30;
  uint32_t local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  int local_14;
  
  Rand::Rand((Rand *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffebc);
  local_14 = 0;
  local_18 = 0;
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  do {
    do {
      do {
        if (99 < local_14) {
          printf("%d %d %d %d %d %d\n",(ulong)local_18,(ulong)local_20,(ulong)local_1c,
                 (ulong)local_24,(ulong)local_28,local_14);
          return;
        }
        local_18 = local_18 + 1;
        local_2c = Rand::rand_u32((Rand *)CONCAT44(in_stack_fffffffffffffec4,
                                                   in_stack_fffffffffffffec0));
        uVar2 = popcount(local_2c);
        if (uVar2 < 0x10) {
          local_2c = 0;
          local_20 = local_20 + 1;
        }
        uVar2 = popcount(local_2c);
        if (0x10 < uVar2) {
          local_2c = 0;
          local_20 = local_20 + 1;
        }
      } while (local_2c == 0);
      for (local_30 = 0; local_30 < 0x20; local_30 = local_30 + 1) {
        uVar2 = rotl32(local_2c,(int8_t)local_30);
        uVar3 = popcount(uVar2 & 0xff);
        if (uVar3 < 3) {
          local_2c = 0;
          local_1c = local_1c + 1;
          break;
        }
        uVar2 = popcount(uVar2 & 0xff);
        if (5 < uVar2) {
          local_2c = 0;
          local_1c = local_1c + 1;
          break;
        }
      }
    } while (local_2c == 0);
    memset(local_138,0,0x100);
    for (in_stack_fffffffffffffec4 = 0; in_stack_fffffffffffffec4 < 0x20;
        in_stack_fffffffffffffec4 = in_stack_fffffffffffffec4 + 1) {
      uVar2 = rotl32(local_2c,(int8_t)in_stack_fffffffffffffec4);
      in_stack_fffffffffffffec0 = uVar2 & 0xff;
      if (local_138[in_stack_fffffffffffffec0] != '\0') {
        local_2c = 0;
        local_24 = local_24 + 1;
        break;
      }
      local_138[in_stack_fffffffffffffec0] = '\x01';
    }
    if (local_2c != 0) {
      bVar1 = isprime(in_stack_ffffffffffffffa0);
      if (!bVar1) {
        local_2c = 0;
        local_28 = local_28 + 1;
      }
      if ((local_2c != 0) && (local_2c != 0)) {
        printf("0x%08x : 0x%08x\n",(ulong)local_2c,(ulong)(local_2c ^ 0xffffffff));
        local_14 = local_14 + 1;
      }
    }
  } while( true );
}

Assistant:

void GenerateMixingConstants ( void )
{
  Rand r(8350147);

  int count = 0;

  int trials = 0;
  int bitfail = 0;
  int popfail = 0;
  int matchfail = 0;
  int primefail = 0;

  //for(uint32_t x = 1; x; x++)
  while(count < 100)
  {
    //if(x % 100000000 == 0) printf(".");

    trials++;
    uint32_t b = r.rand_u32();
    //uint32_t b = x;

    //----------
    // must have between 14 and 18 set bits

    if(popcount(b) < 16) { b = 0; popfail++; }
    if(popcount(b) > 16) { b = 0; popfail++; }

    if(b == 0) continue;

    //----------
    // must have 3-5 bits set per 8-bit window

    for(int i = 0; i < 32; i++)
    {
      uint32_t c = ROTL32(b,i) & 0xFF;

      if(popcount(c) < 3) { b = 0; bitfail++; break; }
      if(popcount(c) > 5) { b = 0; bitfail++; break; }
    }

    if(b == 0) continue;

    //----------
    // all 8-bit windows must be different

    uint8_t match[256];

    memset(match,0,256);

    for(int i = 0; i < 32; i++)
    {
      uint32_t c = ROTL32(b,i) & 0xFF;
      
      if(match[c]) { b = 0; matchfail++; break; }

      match[c] = 1;
    }

    if(b == 0) continue;

    //----------
    // must be prime

    if(!isprime(b))
    {
      b = 0;
      primefail++;
    }

    if(b == 0) continue;

    //----------

    if(b)
    {
      printf("0x%08x : 0x%08x\n",b,~b);
      count++;
    }
  }

  printf("%d %d %d %d %d %d\n",trials,popfail,bitfail,matchfail,primefail,count);
}